

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O1

void __thiscall
chrono::utils::ChISO2631_1_UpwardStep::Config
          (ChISO2631_1_UpwardStep *this,double step,double f5,double f6,double Q5,double Q6)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_register_000012c8 [56];
  undefined1 auVar9 [64];
  undefined8 in_XMM4_Qb;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  auVar9._8_56_ = in_register_000012c8;
  auVar9._0_8_ = Q5;
  this->m_Ts = step;
  dVar1 = f5 * 6.283185307179586;
  this->m_wc5 = dVar1;
  dVar2 = f6 * 6.283185307179586;
  this->m_wc6 = dVar2;
  this->m_Q5 = Q5;
  this->m_Q6 = Q6;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar1 * step * Q5 * step;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (step + step) * dVar1;
  auVar13 = vfmadd231sd_fma(auVar13,auVar10,auVar6);
  auVar14 = ZEXT816(0x4010000000000000);
  auVar8 = auVar9._0_16_;
  auVar13 = vfmadd231sd_fma(auVar13,auVar8,auVar14);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = Q5 * -2.0 * step * step * dVar1 * dVar1;
  auVar16 = vfmadd231sd_fma(auVar16,auVar8,ZEXT816(0x4020000000000000));
  auVar17._8_8_ = 0;
  auVar17._0_8_ = step * -2.0 * dVar1;
  auVar6 = vfmadd231sd_fma(auVar17,auVar10,auVar6);
  auVar6 = vfmadd231sd_fma(auVar6,auVar8,auVar14);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar2 * step * Q6 * step;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (step + step) * dVar2;
  auVar8 = vfmadd231sd_fma(auVar12,auVar11,auVar7);
  auVar3._8_8_ = in_XMM4_Qb;
  auVar3._0_8_ = Q6;
  auVar8 = vfmadd231sd_fma(auVar8,auVar3,auVar14);
  dVar1 = auVar8._0_8_ * Q5;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar2 * dVar2 * Q6 * -2.0 * step * step;
  auVar8._8_8_ = in_XMM4_Qb;
  auVar8._0_8_ = Q6;
  auVar8 = vfmadd231sd_fma(auVar5,auVar8,ZEXT816(0x4020000000000000));
  auVar15._8_8_ = 0;
  auVar15._0_8_ = step * -2.0 * dVar2;
  auVar3 = vfmadd231sd_fma(auVar15,auVar11,auVar7);
  auVar4._8_8_ = in_XMM4_Qb;
  auVar4._0_8_ = Q6;
  auVar3 = vfmadd231sd_fma(auVar3,auVar4,auVar14);
  this->m_b0 = (auVar13._0_8_ * Q6) / dVar1;
  this->m_b1 = (auVar16._0_8_ * -Q6) / dVar1;
  this->m_b2 = (auVar6._0_8_ * Q6) / dVar1;
  this->m_a1 = (-Q5 * auVar8._0_8_) / dVar1;
  this->m_a2 = (auVar3._0_8_ * Q5) / dVar1;
  this->m_a0 = 1.0;
  this->m_u_hist1 = 0.0;
  this->m_u_hist2 = 0.0;
  this->m_y_hist1 = 0.0;
  this->m_y_hist2 = 0.0;
  return;
}

Assistant:

void ChISO2631_1_UpwardStep::Config(double step, double f5, double f6, double Q5, double Q6) {
    m_Ts = step;

    m_wc5 = CH_C_2PI * f5;
    m_wc6 = CH_C_2PI * f6;
    m_Q5 = Q5;
    m_Q6 = Q6;

    m_b0 = m_Q6 * (m_Q5 * m_Ts * m_Ts * m_wc5 * m_wc5 + 2.0 * m_Ts * m_wc5 + 4.0 * m_Q5);
    m_b1 = -m_Q6 * (8.0 * m_Q5 - 2.0 * m_Q5 * m_Ts * m_Ts * m_wc5 * m_wc5);
    m_b2 = m_Q6 * (m_Q5 * m_Ts * m_Ts * m_wc5 * m_wc5 - 2.0 * m_Ts * m_wc5 + 4.0 * m_Q5);

    m_a0 = m_Q5 * (m_Q6 * m_Ts * m_Ts * m_wc6 * m_wc6 + 2.0 * m_Ts * m_wc6 + 4.0 * m_Q6);
    m_a1 = -m_Q5 * (8.0 * m_Q6 - 2.0 * m_Q6 * m_Ts * m_Ts * m_wc6 * m_wc6);
    m_a2 = m_Q5 * (m_Q6 * m_Ts * m_Ts * m_wc6 * m_wc6 - 2.0 * m_Ts * m_wc6 + 4.0 * m_Q6);

    m_b0 /= m_a0;
    m_b1 /= m_a0;
    m_b2 /= m_a0;

    m_a1 /= m_a0;
    m_a2 /= m_a0;
    m_a0 = 1.0;

    Reset();
}